

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneT.cpp
# Opt level: O3

void __thiscall
PermutazioneT::randomSS
          (PermutazioneT *this,PermutazioneT *p,unsigned_short *spostamenti,double F,Coppia *coppie)

{
  ushort uVar1;
  long lVar2;
  unsigned_short *puVar3;
  result_type rVar4;
  void *__s;
  void *__s_00;
  void *pvVar5;
  double dVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  void *pvVar13;
  void *pvVar14;
  double dVar15;
  int iVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  double dVar20;
  double dVar21;
  uint local_88;
  uint local_84;
  double local_80;
  void *local_78;
  ulong local_70;
  double local_68;
  PermutazioneT *local_60;
  int local_54;
  ushort *local_50;
  uniform_int_distribution<int> local_48;
  Coppia *local_40;
  ulong local_38;
  
  uVar12 = (p->super_Permutazione).dimensione;
  uVar11 = (ulong)uVar12;
  local_80 = F;
  local_60 = p;
  local_50 = spostamenti;
  local_40 = coppie;
  local_78 = operator_new__((ulong)((uint)uVar12 * 8));
  uVar7 = (ulong)((uint)uVar12 + (uint)uVar12);
  __s = operator_new__(uVar7);
  __s_00 = operator_new__(uVar11);
  memset(__s_00,0,uVar11);
  pvVar5 = memset(__s,0,uVar7);
  pvVar14 = local_78;
  if (uVar12 != 0) {
    uVar17 = 0;
    do {
      pvVar5 = operator_new__(uVar7);
      *(void **)((long)pvVar14 + uVar17 * 8) = pvVar5;
      uVar17 = uVar17 + 1;
    } while (uVar11 != uVar17);
    pvVar14 = (void *)0x0;
    if (uVar11 != 0) {
      uVar8 = 0;
      dVar20 = 0.0;
      uVar11 = 0;
      do {
        if (*(char *)((long)__s_00 + (long)pvVar14) == '\0') {
          uVar7 = (ulong)dVar20 & 0xffff;
          lVar2 = *(long *)((long)local_78 + uVar7 * 8);
          puVar3 = (local_60->super_Permutazione).individuo;
          uVar12 = *(ushort *)((long)__s + uVar7 * 2);
          pvVar5 = pvVar14;
          pvVar13 = (void *)((ulong)pvVar14 & 0xffffffff);
          do {
            uVar17 = (ulong)uVar12;
            uVar12 = uVar12 + 1;
            *(ushort *)((long)__s + uVar7 * 2) = uVar12;
            *(short *)(lVar2 + uVar17 * 2) = (short)pvVar13;
            *(undefined1 *)((long)__s_00 + (long)pvVar5) = 1;
            pvVar5 = (void *)(ulong)puVar3[(long)pvVar5];
            pvVar13 = pvVar5;
          } while (*(char *)((long)__s_00 + (long)pvVar5) != '\x01');
          uVar8 = uVar8 + 1;
          if (uVar12 < 2) {
            *(undefined2 *)((long)__s + uVar7 * 2) = 0;
          }
          else {
            uVar11 = (ulong)((int)uVar11 + ((uVar12 - 1) * (uint)uVar12 >> 1));
            dVar20 = (double)(ulong)(SUB84(dVar20,0) + 1);
          }
        }
        local_84 = (uint)pvVar5;
        pvVar14 = (void *)((long)pvVar14 + 1);
        uVar12 = (local_60->super_Permutazione).dimensione;
        uVar18 = (uint)uVar12;
      } while (pvVar14 < (void *)(ulong)uVar12);
      uVar8 = uVar8 & 0xffff;
      goto LAB_0010888d;
    }
  }
  pvVar14 = (void *)0x0;
  local_84 = (uint)pvVar5;
  uVar11 = 0;
  dVar20 = 0.0;
  uVar8 = 0;
  uVar18 = 0;
LAB_0010888d:
  local_88 = (uint)pvVar14;
  dVar21 = ceil((double)(int)(uVar18 - uVar8) * local_80);
  *local_50 = 0;
  if ((SUB82(dVar20,0) != 0) && (local_54 = (int)dVar21, 0 < local_54)) {
    uVar8 = 0;
    do {
      local_38 = (ulong)uVar8;
      dVar20 = (double)((ulong)dVar20 & 0xffff);
      local_48._M_param._M_b = (int)uVar11 + -1;
      local_48._M_param._M_a = 0;
      rVar4 = std::uniform_int_distribution<int>::operator()
                        (&local_48,&genRand.gen,&local_48._M_param);
      dVar21 = 0.0;
      iVar9 = 0;
      do {
        uVar12 = *(ushort *)((long)__s + (long)dVar21 * 2);
        iVar9 = (int)((uVar12 - 1) * (uint)uVar12) / 2 + iVar9;
        if (rVar4 < iVar9) {
          dVar6 = (double)((ulong)dVar21 & 0xffffffff);
          dVar15 = dVar21;
          break;
        }
        dVar21 = (double)((long)dVar21 + 1);
        dVar6 = dVar20;
        dVar15 = dVar20;
      } while (dVar20 != dVar21);
      uVar12 = *(ushort *)((long)__s + (long)dVar6 * 2);
      uVar18 = (uint)uVar12;
      local_68 = dVar20;
      Random::dueIndiciRandom(&genRand,uVar18,(int *)&local_88,(int *)&local_84);
      dVar20 = local_68;
      uVar8 = local_88;
      pvVar14 = *(void **)((long)local_78 + (long)dVar6 * 8);
      uVar1 = *local_50;
      local_40[uVar1].x = (uint)*(ushort *)((long)pvVar14 + (long)(int)local_88 * 2);
      local_40[uVar1].y = (uint)*(ushort *)((long)pvVar14 + (long)(int)local_84 * 2);
      *local_50 = uVar1 + 1;
      if ((int)local_84 < (int)local_88) {
        local_88 = local_84;
        local_84 = uVar8;
      }
      local_70 = (ulong)(uint)((int)uVar11 - (int)((uVar18 - 1) * (uint)uVar12) / 2);
      iVar9 = (local_88 - local_84) + uVar18;
      iVar16 = local_84 - local_88;
      iVar19 = SUB84(local_68,0);
      local_80 = dVar6;
      if (iVar16 < 2 || iVar9 < 2) {
        if (iVar16 == 1 && 1 < iVar9) {
          if (0 < (int)(~local_84 + uVar18)) {
            memmove((void *)((long)pvVar14 + (long)(int)local_88 * 2 + 2),
                    (void *)((long)pvVar14 + (long)(int)local_84 * 2 + 2),
                    (ulong)((~local_84 + uVar18) * 2));
          }
          *(short *)((long)__s + (long)local_80 * 2) = (short)iVar9;
          uVar8 = (iVar9 + -1) * iVar9;
        }
        else {
          if (iVar16 < 2) {
            dVar20 = (double)(ulong)(iVar19 - 1);
            uVar7 = (ulong)dVar20 & 0xffff;
            uVar11 = local_70;
            if (SUB84(dVar15,0) != (int)uVar7) {
              uVar12 = *(ushort *)((long)__s + uVar7 * 2);
              memcpy(pvVar14,*(void **)((long)local_78 + uVar7 * 8),(ulong)((uint)uVar12 * 2));
              *(ushort *)((long)__s + (long)local_80 * 2) = uVar12;
              uVar11 = local_70;
            }
            goto LAB_00108b38;
          }
          memmove(pvVar14,(void *)((long)pvVar14 + (long)(int)local_88 * 2 + 2),
                  (ulong)(uint)(iVar16 * 2));
          *(short *)((long)__s + (long)local_80 * 2) = (short)iVar16;
          uVar8 = (iVar16 + -1) * iVar16;
        }
        uVar11 = (ulong)((uVar8 >> 1) + (int)local_70);
        dVar20 = local_68;
      }
      else {
        memcpy(*(void **)((long)local_78 + (long)local_68 * 8),
               (void *)((long)pvVar14 + (long)(int)local_88 * 2 + 2),(ulong)(uint)(iVar16 * 2));
        *(short *)((long)__s + (long)dVar20 * 2) = (short)iVar16;
        iVar10 = ~local_84 + (uint)*(ushort *)((long)__s + (long)local_80 * 2);
        if (0 < iVar10) {
          memmove((void *)((long)pvVar14 + (long)(int)local_88 * 2 + 2),
                  (void *)((long)pvVar14 + (long)(int)local_84 * 2 + 2),(ulong)(uint)(iVar10 * 2));
        }
        *(short *)((long)__s + (long)local_80 * 2) = (short)iVar9;
        uVar11 = (ulong)(((uint)((iVar16 + -1) * iVar16 + (iVar9 + -1) * iVar9) >> 1) +
                        (int)local_70);
        dVar20 = (double)(ulong)(iVar19 + 1);
      }
LAB_00108b38:
    } while ((SUB82(dVar20,0) != 0) && (uVar8 = (int)local_38 + 1, (int)uVar8 < local_54));
  }
  operator_delete__(__s_00);
  operator_delete__(__s);
  pvVar14 = local_78;
  local_88 = 0;
  uVar12 = (local_60->super_Permutazione).dimensione;
  if (uVar12 != 0) {
    do {
      pvVar5 = *(void **)((long)pvVar14 + (long)(int)local_88 * 8);
      if (pvVar5 != (void *)0x0) {
        operator_delete__(pvVar5);
        uVar12 = (local_60->super_Permutazione).dimensione;
      }
      local_88 = local_88 + 1;
    } while ((int)local_88 < (int)(uint)uVar12);
  }
  operator_delete__(pvVar14);
  return;
}

Assistant:

void PermutazioneT::randomSS(PermutazioneT* p, unsigned short& spostamenti, double F, Coppia* coppie) {

	unsigned short** c = new unsigned short*[p->dimensione];
	unsigned short* lc = new unsigned short [p->dimensione];
	bool* v = new bool[p->dimensione];

	memset(v, 0, sizeof(bool) * p->dimensione);
	memset(lc, 0, sizeof(unsigned short) * p->dimensione);

	unsigned short nc1 = 0, nc = 0;

	int i, j, k, nit = 0, lim, r, nexc = 0, psum, t, lc1, lc2;

	for (i = 0; i < p->dimensione; i++) {
		c[i] = new unsigned short[p->dimensione];
	}

	for (i = 0; i < p->dimensione; i++) {
		if (v[i]) continue;
		j = i;
		while (!v[j]) {
			c[nc][lc[nc]++] = j;
			v[j] = true;
			j = p->individuo[j];
		}
		nc1++; 

		if (lc[nc] > 1) {
			nexc += lc[nc] * (lc[nc] - 1) / 2;
			nc++;
		}
		else
			lc[nc] = 0;
	}

	lim = ceil(F * (p->dimensione - nc1)); 

	spostamenti = 0;
	while (nc > 0 && nit < lim) {

		r = genRand.randIntU(0, nexc-1);
		psum = 0;
		for (k = 0; k < nc; k++) {
			psum += lc[k] * (lc[k] - 1) / 2;
			if (r < psum) break;
		}

		genRand.dueIndiciRandom(lc[k], i, j);

		coppie[spostamenti].x = c[k][i];
		coppie[spostamenti].y = c[k][j];
		spostamenti++;

		nexc -= lc[k] * (lc[k] - 1) / 2; 
		if (i > j) {
			t = i;
			i = j;
			j = t;
		}

		lc1 = i - j + lc[k];	
		lc2 = j - i;			

		if (lc1 > 1 && lc2 > 1) { 

			memcpy(c[nc], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[nc] = lc2;
			nc++;
			
			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;

			nexc += (lc1 * (lc1 - 1) + lc2 * (lc2 - 1)) / 2;	
		}
		else if (lc1 > 1 && lc2 == 1) { 

			t = lc[k] - j - 1;	
			if (t > 0) memmove(c[k] + (i + 1), c[k] + (j + 1), sizeof(unsigned short) * t);
			lc[k] = lc1;
	
			nexc += lc1 * (lc1 - 1) / 2;
		}
		else if (lc2 > 1) { 

			memmove(c[k], c[k] + (i + 1), sizeof(unsigned short) * lc2);
			lc[k] = lc2;
		
			nexc += lc2 * (lc2 - 1) / 2;	
		}
		else { 

			nc--;
			if (k != nc) {
				memcpy(c[k], c[nc], sizeof(unsigned short) * lc[nc]);
				lc[k] = lc[nc];
			}
			
		}

		nit++;
	}
	delete[] v;
	delete[] lc;

	for (i = 0; i < p->dimensione; i++) {
		delete[] c[i];
	}
	delete[] c;
}